

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

Option * __thiscall CLI::Option::expected(Option *this,int value)

{
  IncorrectConstruction *pIVar1;
  string sStack_78;
  string local_58;
  string local_38;
  
  if (this->expected_ != value) {
    if (value == 0) {
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_38,this);
      IncorrectConstruction::Set0Opt(pIVar1,&local_38);
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,Error::~Error);
    }
    if (this->changeable_ == false) {
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&local_58,this);
      IncorrectConstruction::ChangeNotVector(pIVar1,&local_58);
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,Error::~Error);
    }
    if ((value != 1) && ((this->super_OptionBase<CLI::Option>).multi_option_policy_ != Throw)) {
      pIVar1 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      single_name_abi_cxx11_(&sStack_78,this);
      IncorrectConstruction::AfterMultiOpt(pIVar1,&sStack_78);
      __cxa_throw(pIVar1,&IncorrectConstruction::typeinfo,Error::~Error);
    }
    this->expected_ = value;
  }
  return this;
}

Assistant:

Option *expected(int value) {
        if(expected_ == value)
            return this;
        else if(value == 0)
            throw IncorrectConstruction::Set0Opt(single_name());
        else if(!changeable_)
            throw IncorrectConstruction::ChangeNotVector(single_name());
        else if(value != 1 && multi_option_policy_ != MultiOptionPolicy::Throw)
            throw IncorrectConstruction::AfterMultiOpt(single_name());

        expected_ = value;
        return this;
    }